

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compare.h
# Opt level: O3

long gimage::cmp<unsigned_char>
               (Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *diff,
               Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *im1,
               Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *im2,
               vector<unsigned_char,_std::allocator<unsigned_char>_> *tol)

{
  pointer puVar1;
  long lVar2;
  long lVar3;
  uint uVar4;
  long lVar5;
  uchar uVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  
  lVar2 = -1;
  if (((im1->width == im2->width) && (im1->height == im2->height)) && (im1->depth == im2->depth)) {
    Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::setSize
              (diff,im1->width,im1->height,(long)im1->depth);
    iVar7 = im1->depth;
    if (iVar7 < 1) {
      lVar2 = 0;
    }
    else {
      lVar3 = 0;
      lVar2 = 0;
      uVar4 = 0;
      do {
        puVar1 = (tol->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        if (lVar3 < *(int *)&(tol->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                             )._M_impl.super__Vector_impl_data._M_finish - (int)puVar1) {
          uVar4 = (uint)puVar1[lVar3];
        }
        lVar9 = im1->height;
        if (0 < lVar9) {
          lVar8 = im1->width;
          lVar5 = 0;
          do {
            if (0 < lVar8) {
              lVar9 = 0;
              do {
                iVar7 = (uint)im1->img[lVar3][lVar5][lVar9] - (uint)im2->img[lVar3][lVar5][lVar9];
                lVar2 = lVar2 + (ulong)((int)uVar4 < iVar7);
                uVar6 = (uchar)iVar7;
                if (iVar7 < 1) {
                  uVar6 = '\0';
                }
                diff->img[lVar3][lVar5][lVar9] = uVar6;
                lVar9 = lVar9 + 1;
                lVar8 = im1->width;
              } while (lVar9 < lVar8);
              lVar9 = im1->height;
            }
            lVar5 = lVar5 + 1;
          } while (lVar5 < lVar9);
          iVar7 = im1->depth;
        }
        lVar3 = lVar3 + 1;
      } while (lVar3 < iVar7);
    }
  }
  return lVar2;
}

Assistant:

long cmp(Image<T> &diff, const Image<T> &im1,
                           const Image<T> &im2, const std::vector<T> &tol)
{
  if (im1.getWidth() != im2.getWidth() || im1.getHeight() != im2.getHeight() ||
      im1.getDepth() != im2.getDepth())
  {
    return -1;
  }

  diff.setSize(im1.getWidth(), im1.getHeight(), im1.getDepth());

  long ret=0;
  typename Image<T>::work_t t=0;

  for (int d=0; d<im1.getDepth(); d++)
  {
    if (d < static_cast<int>(tol.size()))
    {
      t=tol[d];
    }

    for (long k=0; k<im1.getHeight(); k++)
    {
      for (long i=0; i<im1.getWidth(); i++)
      {
        typename Image<T>::work_t v1=im1.getW(i, k, d);
        typename Image<T>::work_t v2=im2.getW(i, k, d);
        typename Image<T>::work_t v;

        if (im1.isValidW(v1) && im2.isValidW(v2))
        {
          v=v1-v2;
        }
        else if (!im1.isValidW(v1) && !im2.isValidW(v2))
        {
          v=0;
        }
        else
        {
          v=Image<T>::ptraits::invalid();
        }

//        if (v < 0)
//        {
//          v=-v;
//        }

        if (v > t)
        {
          ret++;
        }

        diff.setLimited(i, k, d, v);
      }
    }
  }

  return ret;
}